

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_normal
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,FaceHandle _fh,Vec3f *_normal)

{
  undefined1 local_20 [8];
  VectorT<double,_3> dst;
  
  if ((((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
       this->mesh_)->face_normals_).super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
      super_BaseHandle.idx_ != -1) {
    local_20 = (undefined1  [8])(double)(_normal->super_VectorDataT<float,_3>).values_[0];
    dst.super_VectorDataT<double,_3>.values_[0] =
         (double)(_normal->super_VectorDataT<float,_3>).values_[1];
    dst.super_VectorDataT<double,_3>.values_[1] =
         (double)(_normal->super_VectorDataT<float,_3>).values_[2];
    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::set_normal
              ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                *)this->mesh_,_fh,(Normal *)local_20);
  }
  return;
}

Assistant:

virtual void set_normal(FaceHandle _fh, const Vec3f& _normal)
  {
    if (mesh_.has_face_normals())
      mesh_.set_normal(_fh, vector_cast<Normal>(_normal));
  }